

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_child(Context *context,IntrinsicResult partialResult)

{
  bool *pbVar1;
  long lVar2;
  anon_union_8_3_2f476f46_for_data aVar3;
  bool bVar4;
  Machine *pMVar5;
  Interpreter *pIVar6;
  long *plVar7;
  undefined8 *puVar8;
  anon_union_8_3_2f476f46_for_data aVar9;
  _func_int **pp_Var10;
  anon_union_8_3_2f476f46_for_data aVar11;
  anon_union_8_3_2f476f46_for_data aVar12;
  ulong uVar13;
  size_t sVar14;
  String filename;
  String pathSep;
  String path;
  anon_union_8_3_2f476f46_for_data local_c0;
  long *local_b8;
  size_t local_b0;
  Context *local_a8;
  anon_union_8_3_2f476f46_for_data local_a0;
  char local_98;
  Value local_90;
  Value local_80;
  anon_union_8_3_2f476f46_for_data local_70;
  char local_68;
  long *local_60;
  char local_58;
  Machine *local_50;
  char local_48;
  undefined1 local_40 [8];
  long *local_38;
  
  local_48 = '\0';
  pMVar5 = (Machine *)operator_new(0x30);
  *(undefined8 *)&pMVar5->storeImplicit = 1;
  pMVar5->standardOutput = (TextOutputMethod)&PTR__StringStorage_001d10b0;
  *(undefined8 *)&pMVar5->yielding = 0xb;
  (pMVar5->functionType).type = ~Null;
  (pMVar5->functionType).noInvoke = true;
  (pMVar5->functionType).localOnly = ~Off;
  *(undefined5 *)&(pMVar5->functionType).field_0x3 = 0xffffffffff;
  pIVar6 = (Interpreter *)operator_new__(0xb);
  pMVar5->interpreter = pIVar6;
  pIVar6->_vptr_Interpreter = (_func_int **)0x6150746e65726170;
  *(undefined4 *)((long)&pIVar6->_vptr_Interpreter + 7) = 0x687461;
  local_50 = pMVar5;
  MiniScript::Context::GetVar
            ((Context *)&local_c0,(String *)partialResult.rs,(LocalOnlyMode)&local_50);
  MiniScript::Value::ToString((Value *)&local_70,(Machine *)&local_c0);
  if ((2 < (byte)local_c0.tempNum._0_1_) && (local_b8 != (long *)0x0)) {
    plVar7 = local_b8 + 1;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (**(code **)(*local_b8 + 8))();
    }
    local_b8 = (long *)0x0;
  }
  if ((local_50 != (Machine *)0x0) && (local_48 == '\0')) {
    pbVar1 = &local_50->storeImplicit;
    *(long *)pbVar1 = *(long *)pbVar1 + -1;
    if (*(long *)pbVar1 == 0) {
      (**(code **)(local_50->standardOutput + 8))();
    }
    local_50 = (Machine *)0x0;
  }
  local_58 = '\0';
  plVar7 = (long *)operator_new(0x30);
  plVar7[1] = 1;
  *plVar7 = (long)&PTR__StringStorage_001d10b0;
  plVar7[3] = 10;
  plVar7[4] = -1;
  puVar8 = (undefined8 *)operator_new__(10);
  plVar7[2] = (long)puVar8;
  *puVar8 = 0x6d614e646c696863;
  *(undefined2 *)(puVar8 + 1) = 0x65;
  local_60 = plVar7;
  MiniScript::Context::GetVar
            ((Context *)local_40,(String *)partialResult.rs,(LocalOnlyMode)&local_60);
  MiniScript::Value::ToString((Value *)&local_c0,(Machine *)local_40);
  if ((2 < local_40[0]) && (local_38 != (long *)0x0)) {
    plVar7 = local_38 + 1;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (**(code **)(*local_38 + 8))();
    }
    local_38 = (long *)0x0;
  }
  if ((local_60 != (long *)0x0) && (local_58 == '\0')) {
    plVar7 = local_60 + 1;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (**(code **)(*local_60 + 8))();
    }
    local_60 = (long *)0x0;
  }
  local_98 = '\0';
  aVar9.ref = (RefCountedStorage *)operator_new(0x30);
  (aVar9.ref)->refCount = 1;
  (aVar9.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
  aVar9.ref[1].refCount = 2;
  aVar9.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
  pp_Var10 = (_func_int **)operator_new__(2);
  aVar9.ref[1]._vptr_RefCountedStorage = pp_Var10;
  *(undefined2 *)pp_Var10 = 0;
  *(undefined2 *)pp_Var10 = 0x2f;
  local_a0.ref = aVar9.ref;
  bVar4 = MiniScript::String::EndsWith((String *)&local_70,(String *)&local_a0);
  aVar3 = local_70;
  aVar12 = local_a0;
  aVar9 = local_c0;
  aVar11 = local_70;
  if (bVar4) {
    if (local_c0.ref == (RefCountedStorage *)0x0) {
      if (local_70.ref != (RefCountedStorage *)0x0) {
        (local_70.ref)->refCount = (local_70.ref)->refCount + 1;
      }
    }
    else if (local_70.ref == (RefCountedStorage *)0x0) {
      (local_c0.ref)->refCount = (local_c0.ref)->refCount + 1;
      aVar11 = local_c0;
    }
    else {
      lVar2 = local_70.ref[1].refCount;
      sVar14 = local_c0.ref[1].refCount;
      local_a8 = context;
      aVar11.ref = (RefCountedStorage *)operator_new(0x30);
      uVar13 = sVar14 + lVar2 + -1;
      (aVar11.ref)->refCount = 1;
      (aVar11.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
      aVar11.ref[1].refCount = uVar13;
      aVar11.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      local_b0 = sVar14;
      pp_Var10 = (_func_int **)operator_new__(uVar13);
      sVar14 = lVar2 - 1;
      aVar11.ref[1]._vptr_RefCountedStorage = pp_Var10;
      memset(pp_Var10,0,uVar13);
      memcpy(pp_Var10,aVar3.ref[1]._vptr_RefCountedStorage,sVar14);
      memcpy((void *)(sVar14 + (long)pp_Var10),aVar9.ref[1]._vptr_RefCountedStorage,local_b0);
      context = local_a8;
    }
    local_80.type = String;
    local_80.noInvoke = false;
    local_80.localOnly = Off;
    local_80.data = aVar11;
    if (aVar11.ref == (RefCountedStorage *)0x0) {
      local_80.data = DAT_001d3308;
    }
    if (local_80.data.ref != (RefCountedStorage *)0x0) {
      (local_80.data.ref)->refCount = (local_80.data.ref)->refCount + 1;
    }
    ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 3),
               &local_80);
    *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
    if ((Temp < local_80.type) && (local_80.data.ref != (RefCountedStorage *)0x0)) {
      plVar7 = &(local_80.data.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(local_80.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_80.data.number = 0.0;
    }
  }
  else {
    if (local_a0.ref == (RefCountedStorage *)0x0) {
      if (local_70.ref != (RefCountedStorage *)0x0) {
        (local_70.ref)->refCount = (local_70.ref)->refCount + 1;
      }
    }
    else if (local_70.ref == (RefCountedStorage *)0x0) {
      (local_a0.ref)->refCount = (local_a0.ref)->refCount + 1;
      aVar11 = local_a0;
    }
    else {
      lVar2 = local_70.ref[1].refCount;
      sVar14 = local_a0.ref[1].refCount;
      local_a8 = context;
      aVar11.ref = (RefCountedStorage *)operator_new(0x30);
      uVar13 = sVar14 + lVar2 + -1;
      (aVar11.ref)->refCount = 1;
      (aVar11.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
      aVar11.ref[1].refCount = uVar13;
      aVar11.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      local_b0 = sVar14;
      pp_Var10 = (_func_int **)operator_new__(uVar13);
      sVar14 = lVar2 - 1;
      aVar11.ref[1]._vptr_RefCountedStorage = pp_Var10;
      memset(pp_Var10,0,uVar13);
      memcpy(pp_Var10,aVar3.ref[1]._vptr_RefCountedStorage,sVar14);
      memcpy((void *)(sVar14 + (long)pp_Var10),aVar12.ref[1]._vptr_RefCountedStorage,local_b0);
      context = local_a8;
    }
    aVar9 = local_c0;
    if (local_c0.ref == (RefCountedStorage *)0x0) {
      aVar12 = aVar11;
      if (aVar11.ref != (RefCountedStorage *)0x0) {
        (aVar11.ref)->refCount = (aVar11.ref)->refCount + 1;
      }
    }
    else if (aVar11.ref == (RefCountedStorage *)0x0) {
      (local_c0.ref)->refCount = (local_c0.ref)->refCount + 1;
      aVar12 = local_c0;
    }
    else {
      lVar2 = aVar11.ref[1].refCount;
      sVar14 = local_c0.ref[1].refCount;
      local_a8 = context;
      aVar12.ref = (RefCountedStorage *)operator_new(0x30);
      uVar13 = sVar14 + lVar2 + -1;
      (aVar12.ref)->refCount = 1;
      (aVar12.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
      aVar12.ref[1].refCount = uVar13;
      aVar12.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      local_b0 = sVar14;
      pp_Var10 = (_func_int **)operator_new__(uVar13);
      sVar14 = lVar2 - 1;
      aVar12.ref[1]._vptr_RefCountedStorage = pp_Var10;
      memset(pp_Var10,0,uVar13);
      memcpy(pp_Var10,aVar11.ref[1]._vptr_RefCountedStorage,sVar14);
      memcpy((void *)(sVar14 + (long)pp_Var10),aVar9.ref[1]._vptr_RefCountedStorage,local_b0);
      context = local_a8;
    }
    local_90.type = String;
    local_90.noInvoke = false;
    local_90.localOnly = Off;
    local_90.data = aVar12;
    if (aVar12.ref == (RefCountedStorage *)0x0) {
      local_90.data = DAT_001d3308;
    }
    if (local_90.data.ref != (RefCountedStorage *)0x0) {
      (local_90.data.ref)->refCount = (local_90.data.ref)->refCount + 1;
    }
    ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 3),
               &local_90);
    *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
    if ((Temp < local_90.type) && (local_90.data.ref != (RefCountedStorage *)0x0)) {
      plVar7 = &(local_90.data.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(local_90.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_90.data.number = 0.0;
    }
    if (aVar12.ref != (RefCountedStorage *)0x0) {
      plVar7 = &(aVar12.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(aVar12.ref)->_vptr_RefCountedStorage[1])(aVar12.number);
      }
    }
  }
  if (aVar11.ref != (RefCountedStorage *)0x0) {
    plVar7 = &(aVar11.ref)->refCount;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (*(aVar11.ref)->_vptr_RefCountedStorage[1])(aVar11.number);
    }
  }
  if ((local_a0.ref != (RefCountedStorage *)0x0) && (local_98 == '\0')) {
    plVar7 = &(local_a0.ref)->refCount;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (*(local_a0.ref)->_vptr_RefCountedStorage[1])();
    }
    local_a0.number = 0.0;
  }
  if ((local_c0.ref != (RefCountedStorage *)0x0) && ((char)local_b8 == '\0')) {
    plVar7 = &(local_c0.ref)->refCount;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (*(local_c0.ref)->_vptr_RefCountedStorage[1])();
    }
    local_c0.number = 0.0;
  }
  if ((local_70.ref != (RefCountedStorage *)0x0) && (local_68 == '\0')) {
    plVar7 = &(local_70.ref)->refCount;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (*(local_70.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_child(Context *context, IntrinsicResult partialResult) {
	String path = context->GetVar("parentPath").ToString();
	String filename = context->GetVar("childName").ToString();
	#if _WIN32 || _WIN64
		String pathSep = "\\";
	#else
		String pathSep = "/";
	#endif
	if (path.EndsWith(pathSep)) return IntrinsicResult(path + filename);
	return IntrinsicResult(path + pathSep + filename);
}